

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

Own<kj::_::ImmediatePromiseNode<kj::_::Void>_> __thiscall
kj::heap<kj::_::ImmediatePromiseNode<kj::_::Void>,kj::_::Void>(kj *this,Void *params)

{
  ImmediatePromiseNode<kj::_::Void> *this_00;
  Void *value;
  ImmediatePromiseNode<kj::_::Void> *extraout_RDX;
  Own<kj::_::ImmediatePromiseNode<kj::_::Void>_> OVar1;
  ExceptionOr<kj::_::Void> local_180;
  NoInfer<kj::_::Void> *local_18;
  Void *params_local;
  
  local_18 = params;
  params_local = (Void *)this;
  this_00 = (ImmediatePromiseNode<kj::_::Void> *)operator_new(0x170);
  value = fwd<kj::_::Void>(local_18);
  _::ExceptionOr<kj::_::Void>::ExceptionOr(&local_180,value);
  _::ImmediatePromiseNode<kj::_::Void>::ImmediatePromiseNode(this_00,&local_180);
  Own<kj::_::ImmediatePromiseNode<kj::_::Void>_>::Own
            ((Own<kj::_::ImmediatePromiseNode<kj::_::Void>_> *)this,this_00,
             (Disposer *)&_::HeapDisposer<kj::_::ImmediatePromiseNode<kj::_::Void>>::instance);
  _::ExceptionOr<kj::_::Void>::~ExceptionOr(&local_180);
  OVar1.ptr = extraout_RDX;
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

Own<T> heap(Params&&... params) {
  // heap<T>(...) allocates a T on the heap, forwarding the parameters to its constructor.  The
  // exact heap implementation is unspecified -- for now it is operator new, but you should not
  // assume this.  (Since we know the object size at delete time, we could actually implement an
  // allocator that is more efficient than operator new.)

  return Own<T>(new T(kj::fwd<Params>(params)...), _::HeapDisposer<T>::instance);
}